

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.cpp
# Opt level: O1

void __thiscall Lz77Encoder::run(Lz77Encoder *this)

{
  char cVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  ulong uVar4;
  uint uVar5;
  ostream *poVar6;
  uint uVar7;
  Lz77Node *node;
  undefined1 *puVar9;
  int iVar10;
  bool bVar11;
  uint uVar12;
  value_type symbol;
  int amount;
  int shift;
  vector<Lz77Node,_std::allocator<Lz77Node>_> table;
  stringstream out;
  char local_251;
  uint local_250;
  uint local_24c;
  int local_248;
  int local_244;
  ulong local_240;
  undefined1 *local_238;
  undefined1 *puStack_230;
  long local_228;
  long *local_220 [2];
  long local_210 [2];
  ulong local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8;
  ulong local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  ulong uVar8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LZ77 encryption...",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_238 = (undefined1 *)0x0;
  puStack_230 = (undefined1 *)0x0;
  local_228 = 0;
  uVar12 = 0;
  while( true ) {
    pcVar2 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar2,
               pcVar2 + (this->super_Cryptor).in_message_._M_string_length);
    uVar8 = local_1b0;
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    if (uVar8 <= uVar12) break;
    local_250 = 0;
    local_248 = 0;
    pcVar2 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar2,
               pcVar2 + (this->super_Cryptor).in_message_._M_string_length);
    cVar1 = *(char *)((long)local_1b8 + (ulong)uVar12);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    uVar8 = (ulong)uVar12;
    local_251 = cVar1;
    local_24c = uVar12;
    do {
      local_240 = (ulong)uVar12;
      local_244 = local_24c - uVar12;
      uVar12 = 0;
      iVar10 = 0;
      local_200 = uVar8;
      while( true ) {
        uVar8 = local_200;
        local_1b8 = local_1a8;
        pcVar2 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar2,
                   pcVar2 + (this->super_Cryptor).in_message_._M_string_length);
        uVar4 = local_1b0;
        uVar7 = (int)uVar8 + uVar12;
        uVar8 = (ulong)uVar7;
        if (uVar8 < local_1b0) {
          local_220[0] = local_210;
          pcVar2 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_220,pcVar2,
                     pcVar2 + (this->super_Cryptor).in_message_._M_string_length);
          cVar1 = *(char *)((long)local_220[0] + uVar8);
          local_1f8[0] = local_1e8;
          pcVar2 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1f8,pcVar2,
                     pcVar2 + (this->super_Cryptor).in_message_._M_string_length);
          uVar5 = (int)local_240 + uVar12;
          bVar11 = uVar5 < local_24c && cVar1 == *(char *)((long)local_1f8[0] + (ulong)uVar5);
        }
        else {
          bVar11 = false;
        }
        if (uVar8 < uVar4) {
          if (local_1f8[0] != local_1e8) {
            operator_delete(local_1f8[0],local_1e8[0] + 1);
          }
          if (local_220[0] != local_210) {
            operator_delete(local_220[0],local_210[0] + 1);
          }
        }
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        if (!bVar11) break;
        uVar12 = uVar12 + 1;
        if (iVar10 == 0) {
          iVar10 = local_244;
        }
      }
      uVar8 = (ulong)local_24c;
      if ((3 < uVar12) && (uVar8 = (ulong)local_24c, (int)local_250 < (int)uVar12)) {
        uVar8 = (ulong)uVar7;
        local_250 = uVar12;
        local_248 = iVar10;
      }
      uVar12 = (int)local_240 - 1;
    } while ((int)local_240 != 0);
    uVar12 = local_24c + local_250;
    pcVar2 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar2,
               pcVar2 + (this->super_Cryptor).in_message_._M_string_length);
    local_251 = *(char *)((long)local_1b8 + (ulong)uVar12);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::vector<Lz77Node,std::allocator<Lz77Node>>::emplace_back<char&,int&,int&>
              ((vector<Lz77Node,std::allocator<Lz77Node>> *)&local_238,&local_251,&local_248,
               (int *)&local_250);
    uVar12 = uVar12 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  puVar3 = puStack_230;
  if (local_238 != puStack_230) {
    puVar9 = local_238;
    do {
      if ((*(int *)(puVar9 + 4) != 0) && (*(int *)(puVar9 + 8) != 0)) {
        local_250._0_1_ = 0x5b;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_250,1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,*(int *)(puVar9 + 4));
        local_250._0_1_ = 0x2c;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_250,1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,*(int *)(puVar9 + 8));
        local_250 = CONCAT31(local_250._1_3_,0x5d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_250,1);
        std::ostream::flush();
      }
      local_250 = CONCAT31(local_250._1_3_,*puVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_250,1);
      std::ostream::flush();
      puVar9 = puVar9 + 0xc;
    } while (puVar9 != puVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,(string *)local_1d8)
  ;
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"encryption done!",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_238 != (undefined1 *)0x0) {
    operator_delete(local_238,local_228 - (long)local_238);
  }
  return;
}

Assistant:

void Lz77Encoder::run() {
  cout << "LZ77 encryption..." << endl;

  //iterate through message & write it into table
  vector<Lz77Node> table;
  for (unsigned int i = 0; i < get_in_message().length(); i++) {

    //initial data
    auto amount = 0;
    auto shift = 0;
    auto initial_i = i;
    auto symbol = get_in_message()[i];

    //iterate through encoded sequence
    for (auto j = i; ; j--) {

      auto temp_amount = 0;
      auto temp_shift = 0;
      auto initial_j = j;

      while (initial_i < get_in_message().length() &&
        get_in_message()[initial_i] == get_in_message()[initial_j] &&
        initial_j < i) {

        initial_i++;
        initial_j++;
        temp_amount++;

        if (temp_shift == 0) {
          //relative offset
          temp_shift = i - j;
        }
      }

      //no reason to refer if repetition is less than 4 chars
      if (temp_amount > amount && temp_amount > 3) {
        amount = temp_amount;
        shift = temp_shift;
      }
      else {
        initial_i = i;
      }

      if (j == 0)
      {
        break;
      }
    }

    i += amount;
    symbol = get_in_message()[i];
    table.emplace_back(symbol, shift, amount);
  }

  stringstream out;
  for (auto& node : table) {
    if (node.get_offset() != 0 && node.get_amount() != 0) {
      out << LEFT_BREAK << node.get_offset() << SEPARATOR << node.get_amount() << RIGHT_BREAK << flush;
    }
    out << node.get_symbol() << flush;
  }
  set_out_message(out.str());

  cout << "encryption done!" << endl;
}